

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bn_add.c
# Opt level: O3

int BN_uadd(BIGNUM *r,BIGNUM *a,BIGNUM *b)

{
  int num;
  ulong *ap;
  int iVar1;
  BIGNUM *pBVar2;
  ulong uVar3;
  long lVar4;
  ulong *puVar5;
  ulong *puVar6;
  ulong uVar7;
  BIGNUM *pBVar8;
  
  pBVar8 = a;
  if (a->top < b->top) {
    pBVar8 = b;
    b = a;
  }
  iVar1 = pBVar8->top;
  num = b->top;
  pBVar2 = bn_wexpand((BIGNUM *)r,iVar1 + 1);
  if (pBVar2 == (BIGNUM *)0x0) {
    iVar1 = 0;
  }
  else {
    r->top = iVar1;
    ap = pBVar8->d;
    puVar5 = r->d;
    uVar3 = bn_add_words(puVar5,ap,b->d,num);
    puVar5 = puVar5 + num;
    if (iVar1 != num) {
      lVar4 = 0;
      puVar6 = puVar5;
      do {
        puVar5 = puVar6 + 1;
        uVar7 = ap[num + lVar4] + uVar3;
        *puVar6 = uVar7;
        uVar3 = (ulong)((uint)uVar3 & (uint)(uVar7 == 0));
        lVar4 = lVar4 + 1;
        puVar6 = puVar5;
      } while (iVar1 - num != (int)lVar4);
    }
    *puVar5 = uVar3;
    r->top = r->top + (int)uVar3;
    r->neg = 0;
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

int BN_uadd(BIGNUM *r, const BIGNUM *a, const BIGNUM *b)
{
    int max, min, dif;
    const BN_ULONG *ap, *bp;
    BN_ULONG *rp, carry, t1, t2;

    bn_check_top(a);
    bn_check_top(b);

    if (a->top < b->top) {
        const BIGNUM *tmp;

        tmp = a;
        a = b;
        b = tmp;
    }
    max = a->top;
    min = b->top;
    dif = max - min;

    if (bn_wexpand(r, max + 1) == NULL)
        return 0;

    r->top = max;

    ap = a->d;
    bp = b->d;
    rp = r->d;

    carry = bn_add_words(rp, ap, bp, min);
    rp += min;
    ap += min;

    while (dif) {
        dif--;
        t1 = *(ap++);
        t2 = (t1 + carry) & BN_MASK2;
        *(rp++) = t2;
        carry &= (t2 == 0);
    }
    *rp = carry;
    r->top += carry;

    r->neg = 0;
    bn_check_top(r);
    return 1;
}